

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::SkipMessage
               (CodedInputStream *input,CodedOutputStream *output)

{
  byte bVar1;
  bool bVar2;
  uint32_t uVar3;
  byte *pbVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  
  do {
    pbVar4 = *(byte **)input;
    if (pbVar4 < *(byte **)(input + 8)) {
      bVar1 = *pbVar4;
      uVar5 = (ulong)bVar1;
      uVar3 = (uint32_t)bVar1;
      if ((char)bVar1 < '\0') goto LAB_0017590e;
      *(byte **)input = pbVar4 + 1;
    }
    else {
      uVar3 = 0;
LAB_0017590e:
      uVar3 = io::CodedInputStream::ReadTagFallback(input,uVar3);
      uVar5 = (ulong)uVar3;
    }
    uVar6 = (uint)uVar5;
    *(uint *)(input + 0x20) = uVar6;
    bVar7 = uVar6 == 0;
    if (bVar7) {
      return bVar7;
    }
    if ((uVar6 & 7) == 4) {
      pbVar4 = output->cur_;
      if ((output->impl_).end_ <= pbVar4) {
        pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar4);
      }
      if (0x7f < uVar6) {
        do {
          uVar6 = (uint)uVar5;
          *pbVar4 = (byte)uVar5 | 0x80;
          uVar5 = uVar5 >> 7;
          pbVar4 = pbVar4 + 1;
        } while (0x3fff < uVar6);
      }
      *pbVar4 = (byte)uVar5;
      output->cur_ = pbVar4 + 1;
      return true;
    }
    bVar2 = SkipField(input,uVar6,output);
    if (!bVar2) {
      return bVar7;
    }
  } while( true );
}

Assistant:

bool WireFormatLite::SkipMessage(io::CodedInputStream* input,
                                 io::CodedOutputStream* output) {
  while (true) {
    uint32_t tag = input->ReadTag();
    if (tag == 0) {
      // End of input.  This is a valid place to end, so return true.
      return true;
    }

    WireFormatLite::WireType wire_type = WireFormatLite::GetTagWireType(tag);

    if (wire_type == WireFormatLite::WIRETYPE_END_GROUP) {
      output->WriteVarint32(tag);
      // Must be the end of the message.
      return true;
    }

    if (!SkipField(input, tag, output)) return false;
  }
}